

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O0

void __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>::TCompactProtocolT
          (TCompactProtocolT<duckdb::SimpleReadTransport> *this,
          shared_ptr<duckdb::SimpleReadTransport> *trans,int32_t string_limit,
          int32_t container_limit)

{
  element_type *peVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  __shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<duckdb::SimpleReadTransport> *in_stack_ffffffffffffffa8;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_stack_ffffffffffffffd8;
  TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::
  shared_ptr<duckdb::SimpleReadTransport,void>
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)in_RSI,
             in_stack_ffffffffffffffa8);
  TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ::TVirtualProtocol(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x232754f);
  *in_RDI = &PTR__TCompactProtocolT_03547cf8;
  peVar1 = std::__shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2>::get(in_RSI);
  in_RDI[5] = peVar1;
  std::stack<short,std::deque<short,std::allocator<short>>>::
  stack<std::deque<short,std::allocator<short>>,void>
            ((stack<short,_std::deque<short,_std::allocator<short>_>_> *)in_RSI);
  *(undefined2 *)(in_RDI + 0x13) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = in_EDX;
  in_RDI[0x14] = 0;
  *(undefined4 *)(in_RDI + 0x15) = 0;
  *(undefined4 *)((long)in_RDI + 0xac) = in_ECX;
  in_RDI[6] = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

TCompactProtocolT(std::shared_ptr<Transport_> trans,
                    int32_t string_limit,
                    int32_t container_limit)
    : TVirtualProtocol<TCompactProtocolT<Transport_> >(trans),
      trans_(trans.get()),
      lastFieldId_(0),
      string_limit_(string_limit),
      string_buf_(nullptr),
      string_buf_size_(0),
      container_limit_(container_limit) {
    booleanField_.name = nullptr;
    boolValue_.hasBoolValue = false;
  }